

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O3

void Omega_h::expand_into<signed_char>
               (Read<signed_char> *a_data,LOs *a2b,Write<signed_char> *b_data,Int width)

{
  long *plVar1;
  Alloc **ppAVar2;
  uint uVar3;
  ulong uVar4;
  Alloc *pAVar5;
  uint n;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  ScopedTimer omega_h_scoped_function_timer;
  type f;
  string __str;
  ScopedTimer local_d1;
  undefined1 local_d0 [24];
  Alloc *pAStack_b8;
  void *local_b0;
  Alloc *local_a8;
  void *local_a0;
  Alloc **local_98;
  long local_90;
  Alloc *local_88;
  long lStack_80;
  Alloc **local_78;
  long local_70;
  Alloc *local_68 [2];
  Write<signed_char> *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,"");
  local_58 = b_data;
  plVar1 = (long *)std::__cxx11::string::append((char *)local_50);
  ppAVar2 = (Alloc **)(plVar1 + 2);
  if ((Alloc **)*plVar1 == ppAVar2) {
    local_88 = *ppAVar2;
    lStack_80 = plVar1[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *ppAVar2;
    local_98 = (Alloc **)*plVar1;
  }
  local_90 = plVar1[1];
  *plVar1 = (long)ppAVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_78 = local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_78,3,0x6a);
  pAVar5 = (Alloc *)0xf;
  if (local_98 != &local_88) {
    pAVar5 = local_88;
  }
  if (pAVar5 < (Alloc *)(local_70 + local_90)) {
    pAVar5 = (Alloc *)0xf;
    if (local_78 != local_68) {
      pAVar5 = local_68[0];
    }
    if ((Alloc *)(local_70 + local_90) <= pAVar5) {
      plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_98)
      ;
      goto LAB_002fea48;
    }
  }
  plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_78);
LAB_002fea48:
  local_d0._0_8_ = local_d0 + 0x10;
  pAVar5 = (Alloc *)(plVar1 + 2);
  if ((Alloc *)*plVar1 == pAVar5) {
    local_d0._16_8_ = pAVar5->size;
    pAStack_b8 = (Alloc *)plVar1[3];
  }
  else {
    local_d0._16_8_ = pAVar5->size;
    local_d0._0_8_ = (Alloc *)*plVar1;
  }
  local_d0._8_8_ = plVar1[1];
  *plVar1 = (long)pAVar5;
  plVar1[1] = 0;
  *(undefined1 *)&pAVar5->size = 0;
  begin_code("expand_into",(char *)local_d0._0_8_);
  if ((Alloc *)local_d0._0_8_ != (Alloc *)(local_d0 + 0x10)) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,(ulong)((long)&local_68[0]->size + 1));
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,(ulong)((long)&local_88->size + 1));
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pAVar5 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar5 & 1) == 0) {
    sVar6 = pAVar5->size;
  }
  else {
    sVar6 = (ulong)pAVar5 >> 3;
  }
  n = (int)(sVar6 >> 2) - 1;
  local_a8 = (a_data->write_).shared_alloc_.alloc;
  uVar7 = n * width;
  if (((ulong)local_a8 & 1) == 0) {
    uVar3 = (uint)local_a8->size;
    uVar4 = (ulong)uVar3;
    uVar8 = uVar7;
  }
  else {
    uVar4 = (ulong)local_a8 >> 3;
    uVar3 = (uint)uVar4;
    uVar8 = uVar3;
  }
  if (uVar7 != uVar3) {
    printf("This error can happen when an array has been subsetted - check sync_array usage vs sync_subset_array:\n a_data.size= %d na= %d width= %d"
           ,uVar4,(ulong)n,(ulong)(uint)width);
    local_a8 = (a_data->write_).shared_alloc_.alloc;
    uVar8 = uVar7;
  }
  if (((ulong)local_a8 & 1) == 0) {
    uVar4 = (ulong)(uint)local_a8->size;
  }
  else {
    uVar4 = (ulong)local_a8 >> 3;
  }
  if (uVar8 != (uint)uVar4) {
    printf("ERROR: a_data.size= %d na= %d width= %d\n",uVar4,(ulong)n,(ulong)(uint)width);
    local_a8 = (a_data->write_).shared_alloc_.alloc;
  }
  if (((ulong)local_a8 & 1) == 0) {
    uVar7 = (uint)local_a8->size;
  }
  else {
    uVar7 = (uint)((ulong)local_a8 >> 3);
  }
  if (uVar8 == uVar7) {
    local_d0._0_8_ = (a2b->write_).shared_alloc_.alloc;
    if ((local_d0._0_8_ & 7) == 0 && (Alloc *)local_d0._0_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_d0._0_8_ = ((Alloc *)local_d0._0_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_d0._0_8_)->use_count = ((Alloc *)local_d0._0_8_)->use_count + 1;
      }
    }
    local_d0._8_8_ = (a2b->write_).shared_alloc_.direct_ptr;
    local_d0._16_4_ = width;
    pAStack_b8 = (local_58->shared_alloc_).alloc;
    if (((ulong)pAStack_b8 & 7) == 0 && pAStack_b8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        pAStack_b8 = (Alloc *)(pAStack_b8->size * 8 + 1);
      }
      else {
        pAStack_b8->use_count = pAStack_b8->use_count + 1;
      }
    }
    local_b0 = (local_58->shared_alloc_).direct_ptr;
    if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_a8 = (Alloc *)(local_a8->size * 8 + 1);
      }
      else {
        local_a8->use_count = local_a8->use_count + 1;
      }
    }
    local_a0 = (a_data->write_).shared_alloc_.direct_ptr;
    parallel_for<Omega_h::expand_into<signed_char>(Omega_h::Read<signed_char>,Omega_h::Read<int>,Omega_h::Write<signed_char>,int)::_lambda(int)_1_>
              (n,(type *)local_d0);
    expand_into<signed_char>(Omega_h::Read<signed_char>,Omega_h::Read<int>,Omega_h::Write<signed_char>,int)
    ::{lambda(int)#1}::~Write((_lambda_int__1_ *)local_d0);
    ScopedTimer::~ScopedTimer(&local_d1);
    return;
  }
  fail("assertion %s failed at %s +%d\n","a_data.size() == na * width",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x6e);
}

Assistant:

void expand_into(Read<T> a_data, LOs a2b, Write<T> b_data, Int width) {
  OMEGA_H_TIME_FUNCTION;
  auto na = a2b.size() - 1;
  if(a_data.size() != na * width) printf("This error can happen when an array has been subsetted - check sync_array usage vs sync_subset_array:\n"
                                         " a_data.size= %d na= %d width= %d", a_data.size(), na, width);
  OMEGA_H_CHECK_PRINTF(a_data.size() == na * width, "a_data.size= %d na= %d width= %d", a_data.size(), na, width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    for (auto b = a2b[a]; b < a2b[a + 1]; ++b) {
      for (Int j = 0; j < width; ++j) {
        b_data[b * width + j] = a_data[a * width + j];
      }
    }
  };
  parallel_for(na, std::move(f));
}